

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O0

void UnitTests::stream_any_details::output_range_or_type<std::vector<int,std::allocator<int>>>
               (ostream *s,vector<int,_std::allocator<int>_> *t,true_type *param_3)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  vector<int,_std::allocator<int>_> *s_00;
  bool bVar1;
  reference t_00;
  const_iterator __last;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  outputter<int> local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  const_iterator first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  true_type *local_20;
  true_type *param_2_local;
  vector<int,_std::allocator<int>_> *t_local;
  ostream *s_local;
  
  local_20 = param_3;
  param_2_local = (true_type *)t;
  t_local = (vector<int,_std::allocator<int>_> *)s;
  std::operator<<(s,"[");
  local_28._M_current =
       (int *)std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)param_2_local);
  first = std::end<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)param_2_local);
  bVar1 = __gnu_cxx::operator!=(&local_28,&first);
  if (bVar1) {
    local_38._M_current =
         (int *)std::begin<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)param_2_local);
    s_00 = t_local;
    local_48 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_38,0);
    t_00 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_48);
    local_40 = stream_any<int>(t_00);
    operator<<((ostream *)s_00,&local_40);
    __first._M_current = local_38._M_current;
    __last = std::end<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)param_2_local);
    std::
    for_each<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,UnitTests::stream_any_details::output_range_or_type<std::vector<int,std::allocator<int>>>(std::ostream&,std::vector<int,std::allocator<int>>const&,std::integral_constant<bool,true>const&)::_lambda(auto:1_const&)_1_>
              (__first,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __last._M_current,(anon_class_8_1_54a39813)t_local);
  }
  std::operator<<((ostream *)t_local,"]");
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::true_type& /*unused*/)
        {
            s << "[";
            if (begin(t) != end(t))
            {
                auto first = begin(t);
                s << stream_any(*first++);
                std::for_each(first, end(t), [&s](const auto& value) { s << ", " << stream_any(value); });
            }
            s << "]";
        }